

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O1

void __thiscall Logger::Logger(Logger *this,string *logPath)

{
  std::ofstream::ofstream(this);
  (this->mLastLog)._M_dataplus._M_p = (pointer)&(this->mLastLog).field_2;
  (this->mLastLog)._M_string_length = 0;
  (this->mLastLog).field_2._M_local_buf[0] = '\0';
  std::ofstream::open((string *)this,(_Ios_Openmode)logPath);
  return;
}

Assistant:

Logger::Logger(const std::string &logPath) {
    mLogStream.open(logPath, std::ios::out);
}